

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O2

myarima_object
myarima(double *x,int N,int *order,int *seasonal,int constant,char *ic,int trace,int approx,
       double offset,double *xreg,int r,int *method)

{
  int s;
  int iVar1;
  int iVar2;
  uint uVar3;
  myarima_object pmVar4;
  double *pdVar5;
  sarimax_object obj;
  double *coeff;
  ulong uVar6;
  double *pdVar7;
  double *ZEROI;
  ulong uVar8;
  ulong uVar9;
  int q;
  int iVar10;
  uint uVar11;
  int p;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  size_t __size;
  ulong uVar16;
  int iVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  ulong local_68;
  uint local_34;
  
  pmVar4 = (myarima_object)malloc(0x38);
  pmVar4->aicc = 1.79769313486232e+308;
  pmVar4->bic = 1.79769313486232e+308;
  pmVar4->aic = 1.79769313486232e+308;
  pmVar4->ic = 1.79769313486232e+308;
  s = 0;
  local_68 = 0;
  iVar2 = 0;
  uVar16 = 0;
  if (order != (int *)0x0) {
    uVar16 = (ulong)(uint)*order;
    iVar2 = order[1];
    local_68 = (ulong)(uint)order[2];
  }
  local_34 = 0;
  iVar10 = 0;
  uVar11 = 0;
  if (seasonal != (int *)0x0) {
    uVar11 = *seasonal;
    iVar10 = seasonal[1];
    local_34 = seasonal[2];
    s = seasonal[3];
  }
  if (method == (int *)0x0) {
    iVar1 = (uint)(approx != 0) * 2;
  }
  else {
    iVar1 = *method;
  }
  lVar15 = (long)N;
  p = (int)uVar16;
  q = (int)local_68;
  if (constant == 1 && iVar10 + iVar2 == 1) {
    pdVar5 = (double *)malloc((long)(r + 1) * lVar15 * 8);
    uVar8 = 0;
    uVar9 = 0;
    if (0 < N) {
      uVar8 = (ulong)(uint)N;
    }
    while (uVar8 != uVar9) {
      pdVar5[uVar9] = (double)(int)(uVar9 + 1);
      uVar9 = uVar9 + 1;
    }
    memcpy(pdVar5 + lVar15,xreg,lVar15 * 8 * (long)r);
    obj = sarimax_init(p,iVar2,q,uVar11,iVar10,local_34,s,r + 1,1,N);
    pmVar4->sarimax = obj;
LAB_0010b42e:
    sarimax_exec(obj,x,pdVar5);
    free(pdVar5);
  }
  else {
    if (0 < r) {
      __size = lVar15 * (ulong)(uint)r * 8;
      pdVar5 = (double *)malloc(__size);
      memcpy(pdVar5,xreg,__size);
      obj = sarimax_init(p,iVar2,q,uVar11,iVar10,local_34,s,r,constant,N);
      pmVar4->sarimax = obj;
      sarimax_setMethod(obj,iVar1);
      goto LAB_0010b42e;
    }
    obj = sarimax_init(p,iVar2,q,uVar11,iVar10,local_34,s,0,constant,N);
    pmVar4->sarimax = obj;
    sarimax_setMethod(obj,iVar1);
    sarimax_exec(obj,x,(double *)0x0);
  }
  if (obj->retval != 1) {
    pmVar4->ic = 1.79769313486232e+308;
    return pmVar4;
  }
  iVar2 = obj->M;
  iVar10 = obj->q + obj->p + obj->P + obj->Q;
  iVar17 = iVar2 + iVar10 + 1;
  if (iVar1 == 2) {
    iVar1 = obj->Nused;
    dVar18 = log(obj->var);
    dVar18 = (double)(iVar17 * 2) + dVar18 * (double)iVar1 + offset;
    obj->aic = dVar18;
  }
  else {
    dVar18 = obj->aic;
  }
  iVar10 = iVar10 + iVar2;
  if ((dVar18 != 0.0) || (NAN(dVar18))) {
    pmVar4->aic = dVar18;
    dVar19 = log((double)obj->Nused);
    dVar19 = (dVar19 + -2.0) * (double)iVar17 + dVar18;
    pmVar4->bic = dVar19;
    uVar3 = obj->Nused;
    dVar20 = (double)((iVar10 + 2) * iVar17 * 2) / (double)(int)((uVar3 - iVar10) + -2) + dVar18;
    pmVar4->aicc = dVar20;
    iVar2 = strcmp(ic,"aic");
    if ((iVar2 != 0) &&
       ((iVar2 = strcmp(ic,"bic"), dVar18 = dVar19, iVar2 != 0 &&
        (iVar2 = strcmp(ic,"aicc"), dVar18 = dVar20, iVar2 != 0)))) goto LAB_0010b5ff;
    pmVar4->ic = dVar18;
  }
  else {
    pmVar4->aicc = 1.79769313486232e+308;
    pmVar4->bic = 1.79769313486232e+308;
    pmVar4->aic = 1.79769313486232e+308;
    pmVar4->ic = 1.79769313486232e+308;
    uVar3 = obj->Nused;
LAB_0010b5ff:
    dVar18 = 1.79769313486232e+308;
  }
  uVar8 = 0;
  uVar9 = 0;
  if (0 < (int)uVar3) {
    uVar9 = (ulong)uVar3;
  }
  dVar19 = 0.0;
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    dVar19 = dVar19 + obj->res[uVar8] * obj->res[uVar8];
  }
  pmVar4->sigma2 = dVar19 / (double)(int)(uVar3 - iVar10);
  iVar10 = p + uVar11 * s + 1;
  uVar14 = uVar11 * s + p;
  iVar2 = local_34 * s + q + 1;
  uVar3 = local_34 * s + q;
  uVar9 = (ulong)uVar3;
  pdVar5 = (double *)calloc((long)iVar10,8);
  coeff = (double *)calloc((long)iVar2,8);
  *coeff = 1.0;
  *pdVar5 = 1.0;
  uVar6 = 0;
  uVar8 = 0;
  if (0 < p) {
    uVar8 = uVar16;
  }
  for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    pdVar5[uVar6 + 1] = obj->phi[uVar6];
  }
  uVar6 = 0;
  uVar16 = 0;
  if (0 < q) {
    uVar16 = local_68;
  }
  for (; uVar16 != uVar6; uVar6 = uVar6 + 1) {
    coeff[uVar6 + 1] = -obj->theta[uVar6];
  }
  lVar15 = (long)s;
  uVar6 = 0;
  uVar12 = 0;
  if (0 < (int)uVar11) {
    uVar12 = (ulong)uVar11;
  }
  pdVar7 = pdVar5 + lVar15 + 1;
  while (uVar6 != uVar12) {
    dVar19 = obj->PHI[uVar6];
    uVar6 = uVar6 + 1;
    pdVar5[uVar6 * lVar15] = pdVar5[uVar6 * lVar15] + dVar19;
    for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
      pdVar7[uVar13] = pdVar7[uVar13] - obj->phi[uVar13] * dVar19;
    }
    pdVar7 = pdVar7 + lVar15;
  }
  uVar8 = 0;
  uVar6 = 0;
  if (0 < (int)local_34) {
    uVar6 = (ulong)local_34;
  }
  pdVar7 = coeff + lVar15 + 1;
  while (uVar8 != uVar6) {
    dVar19 = obj->THETA[uVar8];
    uVar8 = uVar8 + 1;
    coeff[uVar8 * lVar15] = coeff[uVar8 * lVar15] - dVar19;
    for (uVar12 = 0; uVar16 != uVar12; uVar12 = uVar12 + 1) {
      pdVar7[uVar12] = obj->theta[uVar12] * dVar19 + pdVar7[uVar12];
    }
    pdVar7 = pdVar7 + lVar15;
  }
  if (iVar2 < iVar10) {
    iVar2 = iVar10;
  }
  pdVar7 = (double *)malloc((long)iVar2 << 3);
  ZEROI = (double *)malloc((long)iVar2 << 3);
  dVar19 = 2.0;
  if (uVar11 + p == 0 || SCARRY4(uVar11,p) != (int)(uVar11 + p) < 0) {
LAB_0010b91a:
    if ((1 < (int)(local_34 + q)) && (dVar18 < 1.79769313486232e+308)) {
      uVar16 = 0xffffffffffffffff;
      uVar8 = 0;
      if ((int)uVar3 < 1) {
        uVar9 = 0;
      }
      for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
        if (1e-08 < ABS(coeff[uVar8 + 1])) {
          uVar16 = uVar8;
        }
        uVar16 = uVar16 & 0xffffffff;
      }
      if (-1 < (int)uVar16) {
        uVar11 = (int)uVar16 + 1;
        iVar2 = polyroot(coeff,uVar11,pdVar7,ZEROI);
        if (iVar2 == 0) {
          for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
            dVar18 = SQRT(pdVar7[uVar16] * pdVar7[uVar16] + ZEROI[uVar16] * ZEROI[uVar16]);
            if (dVar19 <= dVar18) {
              dVar18 = dVar19;
            }
            dVar19 = dVar18;
          }
        }
        else {
          pmVar4->ic = 1.79769313486232e+308;
        }
      }
    }
    if (1.01 <= dVar19) goto LAB_0010b9bc;
  }
  else {
    uVar8 = 0;
    uVar16 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar16 = uVar8;
    }
    uVar6 = 0xffffffffffffffff;
    for (; uVar16 != uVar8; uVar8 = uVar8 + 1) {
      if (1e-08 < ABS(pdVar5[uVar8 + 1])) {
        uVar6 = uVar8;
      }
      uVar6 = uVar6 & 0xffffffff;
    }
    if ((int)uVar6 < 0) goto LAB_0010b91a;
    uVar11 = (int)uVar6 + 1;
    for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
      pdVar5[uVar16 + 1] = -pdVar5[uVar16 + 1];
    }
    iVar2 = polyroot(pdVar5,uVar11,pdVar7,ZEROI);
    if (iVar2 == 0) {
      dVar19 = 2.0;
      for (uVar16 = 0; uVar11 != uVar16; uVar16 = uVar16 + 1) {
        dVar20 = SQRT(pdVar7[uVar16] * pdVar7[uVar16] + ZEROI[uVar16] * ZEROI[uVar16]);
        if (dVar19 <= dVar20) {
          dVar20 = dVar19;
        }
        dVar19 = dVar20;
      }
      goto LAB_0010b91a;
    }
  }
  pmVar4->ic = 1.79769313486232e+308;
LAB_0010b9bc:
  free(pdVar5);
  free(coeff);
  free(pdVar7);
  free(ZEROI);
  return pmVar4;
}

Assistant:

myarima_object myarima(double *x, int N, int *order, int *seasonal, int constant, const char* ic, int trace, int approx,
	double offset, double *xreg, int r, int *method) {

	myarima_object fit = NULL;
	int m,p,d,q,P,D,Q,s,diffs,i,j,imean,ncoeff,isum,imx,rr;
	int use_season,rmethod,last_nonzero,ip,iq,ir,retval;
	double rsum,minroot,tol,temp;
	double *xreg2,*phi,*theta,*zeror,*zeroi;
	int *K;

	fit = (myarima_object) malloc (sizeof(struct myarima_set));
	
	fit->ic = fit->aic = fit->bic = fit->aicc = DBL_MAX;

	tol = 1e-08;

	if (order) {
		p = order[0];
		d = order[1];
		q = order[2];
	} else {
		p = 0;
		d = 0;
		q = 0;
	}

	if (seasonal) {
		P = seasonal[0];
		D = seasonal[1];
		Q = seasonal[2];
		s = seasonal[3];
		if ( s > 0) {
			m = s;
		} else {
			m = 1;
		}
	} else {
		P = 0;
		D = 0;
		Q = 0;
		s = 0;
		m = 1;
	}

	diffs = d + D;

	if ( P + D + Q > 0 && s > 0) {
		use_season = 1;
	} else {
		use_season = 0;
	}

	if (method == NULL) {
		if (approx) {
			rmethod = 2;
		} else {
			rmethod = 0;
		}
	} else {
		rmethod = *method;
	}

	rr = r;

	if (diffs == 1 && constant == 1) {
		imean = 1;
		rr++;
		xreg2 = (double*)malloc(sizeof(double)*N*rr);
		for(i = 0; i < N;++i) {
			xreg2[i] = (double) (i+1);
		}
		memcpy(xreg2+N,xreg,sizeof(double)*N*(rr-1));
		fit->sarimax = sarimax_init(p,d,q,P,D,Q,s,rr,imean,N);
		sarimax_exec(fit->sarimax,x,xreg2);
		free(xreg2);
		//sarimax_summary(fit->sarimax);
	} else {
		imean = constant;
		if (rr > 0) {
			xreg2 = (double*)malloc(sizeof(double)*N*rr);
			memcpy(xreg2,xreg,sizeof(double)*N*rr);
			fit->sarimax = sarimax_init(p,d,q,P,D,Q,s,rr,imean,N);
			sarimax_setMethod(fit->sarimax,rmethod);
			sarimax_exec(fit->sarimax,x,xreg2);
			free(xreg2);
		} else {
			//printf("p: %d d: %d q: %d P: %d D: %d Q: %d s: %d imean %d \n",p,d,q,P,D,Q,s,imean);
			fit->sarimax = sarimax_init(p,d,q,P,D,Q,s,0,imean,N);
			sarimax_setMethod(fit->sarimax,rmethod);
			//mdisplay(x,1,N);
			sarimax_exec(fit->sarimax,x,NULL);
			//sarimax_summary(fit->sarimax);
		}
		
	}

	if (fit->sarimax->retval == 1) {
		ncoeff = (fit->sarimax->p + fit->sarimax->q + fit->sarimax->P + fit->sarimax->Q + fit->sarimax->M) + 1;

		if (rmethod == 2) {
			fit->sarimax->aic = offset + fit->sarimax->Nused * log(fit->sarimax->var) + 2 * ncoeff;// sigma2 
		}

		if (fit->sarimax->aic) {
			fit->aic = fit->sarimax->aic;
			fit->bic = fit->aic + ncoeff * (log((double)fit->sarimax->Nused) - 2.0);
			fit->aicc = fit->aic + 2 * ncoeff * (ncoeff + 1) / (double) (fit->sarimax->Nused - ncoeff - 1);
			if (!strcmp(ic,"aic")) {
				fit->ic = fit->aic;
			} else if (!strcmp(ic,"bic")) {
				fit->ic = fit->bic;
			} else if (!strcmp(ic,"aicc")) {
				fit->ic = fit->aicc;
			}
		} else {
			fit->ic = fit->aic = fit->bic = fit->aicc = DBL_MAX;
		}

		//printf("aic %g bic %g aicc %g ic %g \n",fit->aic,fit->bic,fit->aicc,fit->ic);

		rsum = 0.0;

		for(i = 0; i < fit->sarimax->Nused;++i) {
			rsum += fit->sarimax->res[i]*fit->sarimax->res[i];
		}

		fit->sigma2 = rsum / (double) (fit->sarimax->Nused - ncoeff + 1);

		minroot = 2.0;

		ip = p + s*P + 1;
		iq = q + s*Q + 1;

		phi = (double*)calloc(ip,sizeof(double));
		theta = (double*)calloc(iq,sizeof(double));

		phi[0] = theta[0] = 1.0;

		for(i = 0; i < p;++i) {
			phi[i+1] = fit->sarimax->phi[i];
		}

		for(i = 0; i < q; ++i) {
			theta[i+1] = -1.0 * fit->sarimax->theta[i];
		}

		for (j = 0; j < P; ++j) {
			phi[(j + 1)*s] += fit->sarimax->PHI[j];
			for (i = 0; i < p; ++i) {
				phi[(j + 1)*s + i + 1] -= fit->sarimax->phi[i] * fit->sarimax->PHI[j];
			}
		}

		for (j = 0; j < Q; ++j) {
			theta[(j + 1)*s] -= fit->sarimax->THETA[j];
			for (i = 0; i < q; ++i) {
				theta[(j + 1)*s + i + 1] += fit->sarimax->theta[i] * fit->sarimax->THETA[j];
			}
		}

		ir = (ip > iq) ? ip : iq;

		K = (int*)malloc(sizeof(int)*ir);
		zeror = (double*)malloc(sizeof(double)*ir);
		zeroi = (double*)malloc(sizeof(double)*ir);

		//printf(" p P %d \n", p+P);

		if (p + P > 0) {
			isum = 0;
			imx = -1;
			for(i = 0; i < ip - 1; ++i) {
				K[i] = (fabs(phi[i+1]) > tol) ? 1 : 0; 
				if (K[i] == 1) {
					isum += 1;
					imx = i;
				}
			}

			last_nonzero = imx + 1;

			if (last_nonzero > 0) {
				for(i = 0; i < last_nonzero; ++i) {
					phi[i+1] *= -1.0;
				}

				retval = polyroot(phi,last_nonzero,zeror,zeroi);

				if (retval == 0) {
					for(i = 0; i < last_nonzero;++i) {
						temp = sqrt(zeror[i]*zeror[i] + zeroi[i]*zeroi[i]);
						if (temp < minroot) minroot = temp;
					}
				} else {
					fit->ic = DBL_MAX;
				}

			}

		}

		//printf(" q Q %d \n", q+Q);

		if (q + Q > 1 && fit->ic < DBL_MAX) {
			isum = 0;
			imx = -1;
			for(i = 0; i < iq - 1; ++i) {
				K[i] = (fabs(theta[i+1]) > tol) ? 1 : 0; 
				if (K[i] == 1) {
					isum += 1;
					imx = i;
				}
			}

			last_nonzero = imx + 1;

			if (last_nonzero > 0) {

				retval = polyroot(theta,last_nonzero,zeror,zeroi);

				if (retval == 0) {
					for(i = 0; i < last_nonzero;++i) {
						temp = sqrt(zeror[i]*zeror[i] + zeroi[i]*zeroi[i]);
						if (temp < minroot) minroot = temp;
					}
				} else {
					fit->ic = DBL_MAX;
				}

			}

			
		}

		if (minroot < 1.01) {
			fit->ic = DBL_MAX;
		}



		free(phi);
		free(theta);
		free(K);
		free(zeror);
		free(zeroi);
	} else {
		fit->ic = DBL_MAX;
	}

	return fit;
}